

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDitheringTests.cpp
# Opt level: O0

char * deqp::gles2::Functional::DitheringCase::getPatternTypeName(PatternType type)

{
  char *pcStack_10;
  PatternType type_local;
  
  if (type == PATTERNTYPE_GRADIENT) {
    pcStack_10 = "gradient";
  }
  else if (type == PATTERNTYPE_UNICOLORED_QUAD) {
    pcStack_10 = "unicolored_quad";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* DitheringCase::getPatternTypeName (const PatternType type)
{
	switch (type)
	{
		case PATTERNTYPE_GRADIENT:			return "gradient";
		case PATTERNTYPE_UNICOLORED_QUAD:	return "unicolored_quad";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}